

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O2

void __thiscall leveldb::AddBoundaryInputsTest::AddBoundaryInputsTest(AddBoundaryInputsTest *this)

{
  Comparator *pCVar1;
  
  (this->all_files_).
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->all_files_).
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->compaction_files_).
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->compaction_files_).
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->level_files_).
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->compaction_files_).
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->level_files_).
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->level_files_).
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->all_files_).
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = BytewiseComparator();
  (this->icmp_).super_Comparator._vptr_Comparator = (_func_int **)&PTR__Comparator_00129230;
  (this->icmp_).user_comparator_ = pCVar1;
  return;
}

Assistant:

AddBoundaryInputsTest() : icmp_(BytewiseComparator()) {}